

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O1

void TestConstExpr::ComparisonTestTU<long,int>(void)

{
  if (ComparisonTestTU<long,int>()::b1 == '\0') {
    ComparisonTestTU<long,int>();
  }
  if (ComparisonTestTU<long,int>()::b2 == '\0') {
    ComparisonTestTU<long,int>();
  }
  if (ComparisonTestTU<long,int>()::b3 == '\0') {
    ComparisonTestTU<long,int>();
  }
  if (ComparisonTestTU<long,int>()::b4 == '\0') {
    ComparisonTestTU<long,int>();
  }
  if (ComparisonTestTU<long,int>()::b5 == '\0') {
    ComparisonTestTU<long,int>();
  }
  if (ComparisonTestTU<long,int>()::b6 == '\0') {
    ComparisonTestTU<long,int>();
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}